

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbeddingValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)2005>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  Result *this;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  undefined1 *puVar2;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_8d;
  TypeCase local_8c;
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_88;
  undefined1 local_70 [40];
  Result result;
  
  puVar2 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar2 == (ModelDescription *)0x0) {
    puVar2 = Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] != 0x7d5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"Model not a word embedding.",(allocator<char> *)local_70);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
    this = &result;
    goto LAB_0028824d;
  }
  Result::Result(&result);
  local_8c = kStringType;
  __l._M_len = 1;
  __l._M_array = &local_8c;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)&local_88,__l,&local_8d);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_70,(CoreML *)&((ModelDescription *)puVar2)->input_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_88,in_R8
            );
  Result::operator=(&result,(Result *)local_70);
  std::__cxx11::string::~string((string *)(local_70 + 8));
  std::
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~_Vector_base(&local_88);
  bVar1 = Result::good(&result);
  if (bVar1) {
    local_8c = kMultiArrayType;
    __l_00._M_len = 1;
    __l_00._M_array = &local_8c;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_88,__l_00,&local_8d);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_70,(CoreML *)&((ModelDescription *)puVar2)->output_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_88,
               in_R8);
    Result::operator=(&result,(Result *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 8));
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base(&local_88);
    bVar1 = Result::good(&result);
    if (!bVar1) goto LAB_0028823b;
    if (format->_oneof_case_[0] == 0x7d5) {
      puVar2 = (undefined1 *)(format->Type_).textclassifier_;
    }
    else {
      puVar2 = Specification::CoreMLModels::_WordEmbedding_default_instance_;
    }
    if (((TextClassifier *)puVar2)->revision_ < 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_70,"Model revision number missing or invalid. Must be >= 2",
                 (allocator<char> *)&local_88);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_70);
    }
    else {
      if (*(long *)(((ulong)(((TextClassifier *)puVar2)->modelparameterdata_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8) != 0) goto LAB_0028823b;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_70,"Model parameter data not set",(allocator<char> *)&local_88);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_70);
    }
    std::__cxx11::string::~string((string *)local_70);
  }
  else {
LAB_0028823b:
    Result::Result(__return_storage_ptr__,&result);
  }
  this = (Result *)&result.m_message;
LAB_0028824d:
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_wordEmbedding>(const Specification::Model& format) {
        const auto& interface = format.description();
        
        // make sure model is a word embedding
        if (!format.has_wordembedding()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a word embedding.");
        }
        
        Result result;
        
        // Validate the inputs: only one input with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the output: only one output with double vector (1d multiArray) type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the model parameters
        const auto &wordEmbedding = format.wordembedding();
        if (wordEmbedding.revision() < 2) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model revision number missing or invalid. Must be >= 2");
        }
        
        if (wordEmbedding.modelparameterdata().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model parameter data not set");
        }
        
        return result;
    }